

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O1

void __thiscall dlib::bsp_context::broadcast_byte(bsp_context *this,char val)

{
  long lVar1;
  range *prVar2;
  ulong uVar3;
  char local_29;
  domain local_28;
  
  local_28 = 0;
  local_29 = val;
  lVar1 = (**(code **)(*(long *)this->_cons + 0x40))();
  if (lVar1 != -1) {
    do {
      if (local_28 != this->_node_id) {
        prVar2 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                 ::operator[](this->_cons,&local_28);
        if (((prVar2->_M_t).
             super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
             .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl)->terminated ==
            false) {
          prVar2 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                   ::operator[](this->_cons,&local_28);
          serialize(&local_29,
                    (ostream *)
                    ((long)&(((prVar2->_M_t).
                              super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                              .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl)->
                            stream).super_basic_istream<char,_std::char_traits<char>_> + 0x10));
          map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
          ::operator[](this->_cons,&local_28);
          std::ostream::flush();
        }
      }
      uVar3 = local_28 + 1;
      local_28 = uVar3;
      lVar1 = (**(code **)(*(long *)this->_cons + 0x40))();
    } while (uVar3 < lVar1 + 1U);
  }
  return;
}

Assistant:

void bsp_context::
    broadcast_byte (
        char val
    )
    {
        for (unsigned long i = 0; i < number_of_nodes(); ++i)
        {
            // don't send to yourself or to terminated nodes
            if (i == node_id() || _cons[i]->terminated)
                continue;

            serialize(val, _cons[i]->stream);
            _cons[i]->stream.flush();
        }
    }